

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_get.c
# Opt level: O2

int set_FMPtrField_by_name(FMFieldList field_list,char *fieldname,void *data,void *ptr_value)

{
  int iVar1;
  FMFieldList p_Var2;
  
  do {
    p_Var2 = field_list;
    if (p_Var2->field_name == (char *)0x0) {
      return 0;
    }
    iVar1 = strcmp(p_Var2->field_name,fieldname);
    field_list = p_Var2 + 1;
  } while (iVar1 != 0);
  *(void **)((long)data + (long)p_Var2->field_offset) = ptr_value;
  return 1;
}

Assistant:

extern int
set_FMPtrField_by_name(FMFieldList field_list, const char *fieldname, void *data, void *ptr_value)
{
    int index;

    for (index = 0; field_list[index].field_name != NULL; index++) {
	if (strcmp(field_list[index].field_name, fieldname) == 0) {
	    break;
	}
    }
    if (field_list[index].field_name == NULL)
	return 0;

    
    *((void**)(((char*)data) + field_list[index].field_offset)) = ptr_value;
    return 1;
}